

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O1

void __thiscall Kernel::normalize(Kernel *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  pointer pfVar7;
  long lVar8;
  float fVar9;
  
  iVar2 = this->height / 2;
  iVar5 = -iVar2;
  fVar9 = 0.0;
  if (iVar5 == iVar2 || SBORROW4(iVar5,iVar2) != iVar2 * -2 < 0) {
    iVar1 = this->width;
    iVar3 = iVar1 / 2;
    iVar4 = -iVar3;
    lVar6 = (long)iVar5;
    pfVar7 = (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)iVar4 + (this->yoff + lVar6) * (long)iVar1 + (long)this->xoff;
    do {
      if (iVar4 == iVar3 || SBORROW4(iVar4,iVar3) != iVar3 * -2 < 0) {
        lVar8 = 0;
        do {
          fVar9 = fVar9 + pfVar7[lVar8];
          lVar8 = lVar8 + 1;
        } while (iVar3 * 2 + 1 != (int)lVar8);
      }
      lVar6 = lVar6 + 1;
      pfVar7 = pfVar7 + iVar1;
    } while (iVar2 + 1 != (int)lVar6);
  }
  this->scale = 1.0 / fVar9;
  return;
}

Assistant:

void Kernel::normalize() {
  float sum = 0.0f;
  for (int y = -height / 2; y <= height / 2; y++) {
    for (int x = -width / 2; x <= width / 2; x++) {
      sum += this->operator()(x, y);
    }
  }
  scale = 1 / sum;
}